

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  pointer pbVar1;
  deUint32 dVar2;
  deUint32 dataType;
  CompressedTexFormat format;
  TestContext *pTVar3;
  RenderContext *pRVar4;
  Context *pCVar5;
  ContextInfo *pCVar6;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  TestNode *node_02;
  TestNode *node_03;
  TestNode *node_04;
  TestNode *node_05;
  char *pcVar7;
  long *plVar8;
  Texture2DFormatCase *pTVar9;
  TextureCubeFormatCase *pTVar10;
  Texture2DArrayFormatCase *pTVar11;
  Texture3DFormatCase *pTVar12;
  long lVar13;
  Texture2DFileCase *pTVar14;
  undefined8 *puVar15;
  TextureCubeFileCase *pTVar16;
  Compressed2DFormatCase *pCVar17;
  CompressedCubeFormatCase *pCVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  long *plVar20;
  size_type *psVar21;
  int iVar22;
  pointer pbVar23;
  pointer *ppbVar24;
  char *__end;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  npotFilenames;
  string descriptionBase;
  pointer *local_228;
  long local_220;
  pointer local_218 [2];
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  string nameBase;
  ios_base local_178 [264];
  long local_70;
  long *local_68 [2];
  long local_58 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  potFilenames;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"unsized",
             "Unsized formats");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sized",
             "Sized formats");
  tcu::TestNode::addChild((TestNode *)this,node_00);
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"compressed",
             "Compressed formats");
  tcu::TestNode::addChild((TestNode *)this,node_01);
  node_02 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_02,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "Sized formats (2D)");
  tcu::TestNode::addChild(node_00,node_02);
  node_03 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_03,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Sized formats (Cubemap)");
  tcu::TestNode::addChild(node_00,node_03);
  node_04 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_04,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d_array",
             "Sized formats (2D Array)");
  tcu::TestNode::addChild(node_00,node_04);
  node_05 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_05,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"3d",
             "Sized formats (3D)");
  tcu::TestNode::addChild(node_00,node_05);
  lVar13 = 0;
  do {
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    dVar2 = *(deUint32 *)((long)&DAT_021324d8 + lVar13);
    dataType = *(deUint32 *)((long)&DAT_021324dc + lVar13);
    local_70 = lVar13;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)((long)&DAT_021324d0 + lVar13),
               (allocator<char> *)&descriptionBase);
    pcVar7 = glu::getTextureFormatName(dVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&npotFilenames,pcVar7,(allocator<char> *)&local_208);
    plVar8 = (long *)std::__cxx11::string::append((char *)&npotFilenames);
    plVar20 = plVar8 + 2;
    if ((long *)*plVar8 == plVar20) {
      local_2b8 = *plVar20;
      lStack_2b0 = plVar8[3];
      local_2c8 = &local_2b8;
    }
    else {
      local_2b8 = *plVar20;
      local_2c8 = (long *)*plVar8;
    }
    local_2c0 = plVar8[1];
    *plVar8 = (long)plVar20;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    glu::getTypeName(dataType);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    psVar21 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar21) {
      descriptionBase.field_2._M_allocated_capacity = *psVar21;
      descriptionBase.field_2._8_8_ = plVar8[3];
      descriptionBase._M_dataplus._M_p = (pointer)&descriptionBase.field_2;
    }
    else {
      descriptionBase.field_2._M_allocated_capacity = *psVar21;
      descriptionBase._M_dataplus._M_p = (pointer)*plVar8;
    }
    descriptionBase._M_string_length = plVar8[1];
    *plVar8 = (long)psVar21;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    pTVar9 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar9,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,dataType,0x80,0x80);
    tcu::TestNode::addChild(node,(TestNode *)pTVar9);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar9 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar9,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,dataType,0x3f,0x70);
    tcu::TestNode::addChild(node,(TestNode *)pTVar9);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar10 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar10,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,dataType,0x40,0x40);
    tcu::TestNode::addChild(node,(TestNode *)pTVar10);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar10 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar10,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,dataType,0x39,0x39);
    tcu::TestNode::addChild(node,(TestNode *)pTVar10);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar11 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar11,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,dataType,0x40,0x40,8);
    tcu::TestNode::addChild(node,(TestNode *)pTVar11);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar11 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar11,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,dataType,0x3f,0x39,7);
    tcu::TestNode::addChild(node,(TestNode *)pTVar11);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar12 = (Texture3DFormatCase *)operator_new(0xf8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture3DFormatCase::Texture3DFormatCase
              (pTVar12,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,dataType,8,0x20,0x10);
    tcu::TestNode::addChild(node,(TestNode *)pTVar12);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar12 = (Texture3DFormatCase *)operator_new(0xf8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture3DFormatCase::Texture3DFormatCase
              (pTVar12,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,dataType,0xb,0x1f,7);
    tcu::TestNode::addChild(node,(TestNode *)pTVar12);
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&npotFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
      operator_delete(descriptionBase._M_dataplus._M_p,
                      descriptionBase.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)nameBase._M_dataplus._M_p != &nameBase.field_2) {
      operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
    }
    lVar13 = local_70 + 0x10;
  } while (lVar13 != 0x80);
  lVar13 = 8;
  do {
    dVar2 = *(deUint32 *)((long)&PTR_anon_var_dwarf_4a4c35_02132550 + lVar13);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)(&UNK_02132548 + lVar13),
               (allocator<char> *)&descriptionBase);
    pcVar7 = glu::getTextureFormatName(dVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&descriptionBase,pcVar7,(allocator<char> *)&local_2c8);
    pTVar9 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&npotFilenames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar9,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,0x80,0x80);
    tcu::TestNode::addChild(node_02,(TestNode *)pTVar9);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar9 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar9,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,0x3f,0x70);
    tcu::TestNode::addChild(node_02,(TestNode *)pTVar9);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar10 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar10,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,0x40,0x40);
    tcu::TestNode::addChild(node_03,(TestNode *)pTVar10);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar10 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar10,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,0x39,0x39);
    tcu::TestNode::addChild(node_03,(TestNode *)pTVar10);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar11 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar11,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,0x40,0x40,8);
    tcu::TestNode::addChild(node_04,(TestNode *)pTVar11);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar11 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar11,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,0x3f,0x39,7);
    tcu::TestNode::addChild(node_04,(TestNode *)pTVar11);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar12 = (Texture3DFormatCase *)operator_new(0xf8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture3DFormatCase::Texture3DFormatCase
              (pTVar12,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,8,0x20,0x10);
    tcu::TestNode::addChild(node_05,(TestNode *)pTVar12);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar12 = (Texture3DFormatCase *)operator_new(0xf8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture3DFormatCase::Texture3DFormatCase
              (pTVar12,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,0xb,0x1f,7);
    tcu::TestNode::addChild(node_05,(TestNode *)pTVar12);
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&npotFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
      operator_delete(descriptionBase._M_dataplus._M_p,
                      descriptionBase.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)nameBase._M_dataplus._M_p != &nameBase.field_2) {
      operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
    }
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x318);
  lVar13 = 8;
  do {
    dVar2 = *(deUint32 *)((long)&PTR_anon_var_dwarf_2613b78_02132860 + lVar13);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)(&UNK_02132858 + lVar13),
               (allocator<char> *)&descriptionBase);
    pcVar7 = glu::getTextureFormatName(dVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&descriptionBase,pcVar7,(allocator<char> *)&local_2c8);
    pTVar9 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&npotFilenames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar9,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,0x80,0x80);
    tcu::TestNode::addChild(node_02,(TestNode *)pTVar9);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar9 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar9,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,0x3f,0x70);
    tcu::TestNode::addChild(node_02,(TestNode *)pTVar9);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar10 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar10,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,0x40,0x40);
    tcu::TestNode::addChild(node_03,(TestNode *)pTVar10);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar10 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar10,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,0x39,0x39);
    tcu::TestNode::addChild(node_03,(TestNode *)pTVar10);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar11 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar11,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,0x40,0x40,8);
    tcu::TestNode::addChild(node_04,(TestNode *)pTVar11);
    ppbVar24 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar24) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    pTVar11 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2c8);
    plVar8 = local_2c8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar11,pTVar3,pRVar4,(char *)plVar8,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,dVar2,0x3f,0x39,7);
    iVar22 = (int)plVar8;
    tcu::TestNode::addChild(node_04,(TestNode *)pTVar11);
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&npotFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
      operator_delete(descriptionBase._M_dataplus._M_p,
                      descriptionBase.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)nameBase._M_dataplus._M_p != &nameBase.field_2) {
      operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
    }
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x58);
  pTVar14 = (Texture2DFileCase *)operator_new(0xf8);
  pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar5 = (this->super_TestCaseGroup).m_context;
  pRVar4 = pCVar5->m_renderCtx;
  pCVar6 = pCVar5->m_contextInfo;
  toStringVector_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&nameBase,(Functional *)init::filenames,(char **)0x8,iVar22);
  Texture2DFileCase::Texture2DFileCase
            (pTVar14,pTVar3,pRVar4,pCVar6,"etc1_2d_pot","GL_ETC1_RGB8_OES, GL_TEXTURE_2D",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&nameBase);
  tcu::TestNode::addChild(node_01,(TestNode *)pTVar14);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&nameBase);
  descriptionBase._M_dataplus._M_p = (pointer)0x0;
  descriptionBase._M_string_length = 0;
  descriptionBase.field_2._M_allocated_capacity = 0;
  nameBase._M_dataplus._M_p = (pointer)&nameBase.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&nameBase,"data/etc1/photo_helsinki_113x89.pkm","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&descriptionBase,
             &nameBase);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nameBase._M_dataplus._M_p != &nameBase.field_2) {
    operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
  }
  pTVar14 = (Texture2DFileCase *)operator_new(0xf8);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  Texture2DFileCase::Texture2DFileCase
            (pTVar14,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar5->m_renderCtx,pCVar5->m_contextInfo,"etc1_2d_npot",
             "GL_ETC1_RGB8_OES, GL_TEXTURE_2D",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&descriptionBase);
  tcu::TestNode::addChild(node_01,(TestNode *)pTVar14);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&descriptionBase);
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar22 = 0;
  do {
    lVar13 = 0;
    do {
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"data/etc1/skybox_","");
      plVar8 = (long *)std::__cxx11::string::append((char *)local_68);
      plVar20 = plVar8 + 2;
      if ((long *)*plVar8 == plVar20) {
        local_1f8 = *plVar20;
        lStack_1f0 = plVar8[3];
        local_208 = &local_1f8;
      }
      else {
        local_1f8 = *plVar20;
        local_208 = (long *)*plVar8;
      }
      local_200 = plVar8[1];
      *plVar8 = (long)plVar20;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_208);
      npotFilenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&npotFilenames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar23 = (pointer)(plVar8 + 2);
      if ((pointer)*plVar8 == pbVar23) {
        npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar23->_M_dataplus)._M_p;
      }
      else {
        npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar23->_M_dataplus)._M_p;
        npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar8;
      }
      npotFilenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar8[1];
      *plVar8 = (long)pbVar23;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&nameBase);
      std::ostream::operator<<(&nameBase,iVar22);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nameBase);
      std::ios_base::~ios_base(local_178);
      pbVar23 = (pointer)0xf;
      if (npotFilenames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&npotFilenames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pbVar23 = npotFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      pbVar1 = (pointer)((long)&((npotFilenames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p +
                        local_220);
      if (pbVar23 < pbVar1) {
        pbVar23 = (pointer)0xf;
        if (local_228 != local_218) {
          pbVar23 = local_218[0];
        }
        if (pbVar23 < pbVar1) goto LAB_0112822c;
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_228,0,(char *)0x0,
                             (ulong)npotFilenames.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
LAB_0112822c:
        puVar15 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&npotFilenames,(ulong)local_228);
      }
      local_2c8 = &local_2b8;
      plVar8 = puVar15 + 2;
      if ((long *)*puVar15 == plVar8) {
        local_2b8 = *plVar8;
        lStack_2b0 = puVar15[3];
      }
      else {
        local_2b8 = *plVar8;
        local_2c8 = (long *)*puVar15;
      }
      local_2c0 = puVar15[1];
      *puVar15 = plVar8;
      puVar15[1] = 0;
      *(undefined1 *)plVar8 = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      descriptionBase._M_dataplus._M_p = (pointer)&descriptionBase.field_2;
      psVar21 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar21) {
        descriptionBase.field_2._M_allocated_capacity = *psVar21;
        descriptionBase.field_2._8_8_ = plVar8[3];
      }
      else {
        descriptionBase.field_2._M_allocated_capacity = *psVar21;
        descriptionBase._M_dataplus._M_p = (pointer)*plVar8;
      }
      descriptionBase._M_string_length = plVar8[1];
      *plVar8 = (long)psVar21;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&potFilenames,
                 &descriptionBase);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
        operator_delete(descriptionBase._M_dataplus._M_p,
                        descriptionBase.field_2._M_allocated_capacity + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_228 != local_218) {
        operator_delete(local_228,(ulong)((long)&(local_218[0]->_M_dataplus)._M_p + 1));
      }
      if (npotFilenames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&npotFilenames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(npotFilenames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((npotFilenames.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if (local_208 != &local_1f8) {
        operator_delete(local_208,local_1f8 + 1);
      }
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
      lVar13 = lVar13 + 8;
    } while (lVar13 != 0x30);
    iVar22 = iVar22 + 1;
    if (iVar22 == 7) {
      pTVar16 = (TextureCubeFileCase *)operator_new(0x100);
      pCVar5 = (this->super_TestCaseGroup).m_context;
      TextureCubeFileCase::TextureCubeFileCase
                (pTVar16,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 pCVar5->m_renderCtx,pCVar5->m_contextInfo,"etc1_cube_pot",
                 "GL_ETC1_RGB8_OES, GL_TEXTURE_CUBE_MAP",&potFilenames);
      tcu::TestNode::addChild(node_01,(TestNode *)pTVar16);
      npotFilenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      npotFilenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      npotFilenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar13 = 0;
      do {
        local_2c8 = &local_2b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2c8,"data/etc1/skybox_61x61_","");
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c8);
        descriptionBase._M_dataplus._M_p = (pointer)&descriptionBase.field_2;
        psVar21 = (size_type *)(plVar8 + 2);
        if ((size_type *)*plVar8 == psVar21) {
          descriptionBase.field_2._M_allocated_capacity = *psVar21;
          descriptionBase.field_2._8_8_ = plVar8[3];
        }
        else {
          descriptionBase.field_2._M_allocated_capacity = *psVar21;
          descriptionBase._M_dataplus._M_p = (pointer)*plVar8;
        }
        descriptionBase._M_string_length = plVar8[1];
        *plVar8 = (long)psVar21;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&descriptionBase);
        nameBase._M_dataplus._M_p = (pointer)&nameBase.field_2;
        psVar21 = (size_type *)(plVar8 + 2);
        if ((size_type *)*plVar8 == psVar21) {
          nameBase.field_2._M_allocated_capacity = *psVar21;
          nameBase.field_2._8_8_ = plVar8[3];
        }
        else {
          nameBase.field_2._M_allocated_capacity = *psVar21;
          nameBase._M_dataplus._M_p = (pointer)*plVar8;
        }
        nameBase._M_string_length = plVar8[1];
        *plVar8 = (long)psVar21;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &npotFilenames,&nameBase);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nameBase._M_dataplus._M_p != &nameBase.field_2) {
          operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
          operator_delete(descriptionBase._M_dataplus._M_p,
                          descriptionBase.field_2._M_allocated_capacity + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,local_2b8 + 1);
        }
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x30);
      pTVar16 = (TextureCubeFileCase *)operator_new(0x100);
      pCVar5 = (this->super_TestCaseGroup).m_context;
      TextureCubeFileCase::TextureCubeFileCase
                (pTVar16,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 pCVar5->m_renderCtx,pCVar5->m_contextInfo,"etc1_cube_npot",
                 "GL_ETC_RGB8_OES, GL_TEXTURE_CUBE_MAP",&npotFilenames);
      tcu::TestNode::addChild(node_01,(TestNode *)pTVar16);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&npotFilenames);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&potFilenames);
      lVar13 = 0x10;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&nameBase,*(char **)((long)init::faceExt + lVar13 + 0x20),
                   (allocator<char> *)&descriptionBase);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&descriptionBase,*(char **)((long)init::faceExt + lVar13 + 0x28),
                   (allocator<char> *)&local_2c8);
        pCVar17 = (Compressed2DFormatCase *)operator_new(0xf0);
        pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pCVar5 = (this->super_TestCaseGroup).m_context;
        pRVar4 = pCVar5->m_renderCtx;
        pCVar6 = pCVar5->m_contextInfo;
        local_2c8 = &local_2b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c8,descriptionBase._M_dataplus._M_p,
                   descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
        std::__cxx11::string::append((char *)&local_2c8);
        plVar8 = local_2c8;
        npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&npotFilenames,nameBase._M_dataplus._M_p,
                   nameBase._M_dataplus._M_p + nameBase._M_string_length);
        std::__cxx11::string::append((char *)&npotFilenames);
        format = *(CompressedTexFormat *)((long)&PTR_anon_var_dwarf_68e3d7_021328e0 + lVar13);
        Compressed2DFormatCase::Compressed2DFormatCase
                  (pCVar17,pTVar3,pRVar4,pCVar6,(char *)plVar8,
                   (char *)npotFilenames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,format,1,0x80,0x40);
        tcu::TestNode::addChild(node_01,(TestNode *)pCVar17);
        if (npotFilenames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(npotFilenames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((npotFilenames.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,local_2b8 + 1);
        }
        pCVar18 = (CompressedCubeFormatCase *)operator_new(0xf8);
        pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pCVar5 = (this->super_TestCaseGroup).m_context;
        pRVar4 = pCVar5->m_renderCtx;
        pCVar6 = pCVar5->m_contextInfo;
        local_2c8 = &local_2b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c8,descriptionBase._M_dataplus._M_p,
                   descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
        std::__cxx11::string::append((char *)&local_2c8);
        plVar8 = local_2c8;
        npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&npotFilenames,nameBase._M_dataplus._M_p,
                   nameBase._M_dataplus._M_p + nameBase._M_string_length);
        std::__cxx11::string::append((char *)&npotFilenames);
        CompressedCubeFormatCase::CompressedCubeFormatCase
                  (pCVar18,pTVar3,pRVar4,pCVar6,(char *)plVar8,
                   (char *)npotFilenames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,format,1,0x40,0x40);
        tcu::TestNode::addChild(node_01,(TestNode *)pCVar18);
        if (npotFilenames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(npotFilenames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((npotFilenames.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,local_2b8 + 1);
        }
        pCVar17 = (Compressed2DFormatCase *)operator_new(0xf0);
        pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pCVar5 = (this->super_TestCaseGroup).m_context;
        pRVar4 = pCVar5->m_renderCtx;
        pCVar6 = pCVar5->m_contextInfo;
        local_2c8 = &local_2b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c8,descriptionBase._M_dataplus._M_p,
                   descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
        std::__cxx11::string::append((char *)&local_2c8);
        plVar8 = local_2c8;
        npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&npotFilenames,nameBase._M_dataplus._M_p,
                   nameBase._M_dataplus._M_p + nameBase._M_string_length);
        std::__cxx11::string::append((char *)&npotFilenames);
        Compressed2DFormatCase::Compressed2DFormatCase
                  (pCVar17,pTVar3,pRVar4,pCVar6,(char *)plVar8,
                   (char *)npotFilenames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,format,1,0x33,0x41);
        tcu::TestNode::addChild(node_01,(TestNode *)pCVar17);
        if (npotFilenames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(npotFilenames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((npotFilenames.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,local_2b8 + 1);
        }
        pCVar18 = (CompressedCubeFormatCase *)operator_new(0xf8);
        pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pCVar5 = (this->super_TestCaseGroup).m_context;
        pRVar4 = pCVar5->m_renderCtx;
        pCVar6 = pCVar5->m_contextInfo;
        local_2c8 = &local_2b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c8,descriptionBase._M_dataplus._M_p,
                   descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
        std::__cxx11::string::append((char *)&local_2c8);
        plVar8 = local_2c8;
        npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&npotFilenames,nameBase._M_dataplus._M_p,
                   nameBase._M_dataplus._M_p + nameBase._M_string_length);
        std::__cxx11::string::append((char *)&npotFilenames);
        CompressedCubeFormatCase::CompressedCubeFormatCase
                  (pCVar18,pTVar3,pRVar4,pCVar6,(char *)plVar8,
                   (char *)npotFilenames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,format,1,0x33,0x33);
        tcu::TestNode::addChild(node_01,(TestNode *)pCVar18);
        if (npotFilenames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(npotFilenames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((npotFilenames.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,local_2b8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
          operator_delete(descriptionBase._M_dataplus._M_p,
                          descriptionBase.field_2._M_allocated_capacity + 1);
        }
        paVar19 = &nameBase.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nameBase._M_dataplus._M_p != paVar19) {
          operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
          paVar19 = extraout_RAX;
        }
        lVar13 = lVar13 + 0x18;
      } while (lVar13 != 0x100);
      return (int)paVar19;
    }
  } while( true );
}

Assistant:

void TextureFormatTests::init (void)
{
	tcu::TestCaseGroup* unsizedGroup	= DE_NULL;
	tcu::TestCaseGroup*	sizedGroup		= DE_NULL;
	tcu::TestCaseGroup* compressedGroup	= DE_NULL;
	addChild((unsizedGroup		= new tcu::TestCaseGroup(m_testCtx, "unsized",		"Unsized formats")));
	addChild((sizedGroup		= new tcu::TestCaseGroup(m_testCtx, "sized",		"Sized formats")));
	addChild((compressedGroup	= new tcu::TestCaseGroup(m_testCtx, "compressed",	"Compressed formats")));

	tcu::TestCaseGroup*	sized2DGroup		= DE_NULL;
	tcu::TestCaseGroup*	sizedCubeGroup		= DE_NULL;
	tcu::TestCaseGroup*	sized2DArrayGroup	= DE_NULL;
	tcu::TestCaseGroup*	sized3DGroup		= DE_NULL;
	sizedGroup->addChild((sized2DGroup			= new tcu::TestCaseGroup(m_testCtx, "2d",			"Sized formats (2D)")));
	sizedGroup->addChild((sizedCubeGroup		= new tcu::TestCaseGroup(m_testCtx, "cube",			"Sized formats (Cubemap)")));
	sizedGroup->addChild((sized2DArrayGroup		= new tcu::TestCaseGroup(m_testCtx, "2d_array",		"Sized formats (2D Array)")));
	sizedGroup->addChild((sized3DGroup			= new tcu::TestCaseGroup(m_testCtx, "3d",			"Sized formats (3D)")));

	struct
	{
		const char*	name;
		deUint32		format;
		deUint32		dataType;
	} texFormats[] =
	{
		{ "alpha",							GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "luminance",						GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "luminance_alpha",				GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb_unsigned_short_5_6_5",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb_unsigned_byte",				GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba_unsigned_short_4_4_4_4",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba_unsigned_short_5_5_5_1",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba_unsigned_byte",				GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format			= texFormats[formatNdx].format;
		deUint32	dataType		= texFormats[formatNdx].dataType;
		string	nameBase		= texFormats[formatNdx].name;
		string	descriptionBase	= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

		unsizedGroup->addChild(new Texture2DFormatCase			(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_pot").c_str(),			(descriptionBase + ", GL_TEXTURE_2D").c_str(),			format, dataType, 128, 128));
		unsizedGroup->addChild(new Texture2DFormatCase			(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_npot").c_str(),		(descriptionBase + ", GL_TEXTURE_2D").c_str(),			format, dataType,  63, 112));
		unsizedGroup->addChild(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_cube_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	format, dataType,  64,  64));
		unsizedGroup->addChild(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_cube_npot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	format, dataType,  57,  57));
		unsizedGroup->addChild(new Texture2DArrayFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_array_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	format, dataType,  64,  64,  8));
		unsizedGroup->addChild(new Texture2DArrayFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_array_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	format, dataType,  63,  57,  7));
		unsizedGroup->addChild(new Texture3DFormatCase			(m_testCtx, m_context.getRenderContext(),	(nameBase + "_3d_pot").c_str(),			(descriptionBase + ", GL_TEXTURE_3D").c_str(),			format, dataType,   8,  32, 16));
		unsizedGroup->addChild(new Texture3DFormatCase			(m_testCtx, m_context.getRenderContext(),	(nameBase + "_3d_npot").c_str(),		(descriptionBase + ", GL_TEXTURE_3D").c_str(),			format, dataType,  11,  31,  7));
	}

	struct
	{
		const char*	name;
		deUint32		internalFormat;
	} sizedColorFormats[] =
	{
		{ "rgba32f",			GL_RGBA32F,			},
		{ "rgba32i",			GL_RGBA32I,			},
		{ "rgba32ui",			GL_RGBA32UI,		},
		{ "rgba16f",			GL_RGBA16F,			},
		{ "rgba16i",			GL_RGBA16I,			},
		{ "rgba16ui",			GL_RGBA16UI,		},
		{ "rgba8",				GL_RGBA8,			},
		{ "rgba8i",				GL_RGBA8I,			},
		{ "rgba8ui",			GL_RGBA8UI,			},
		{ "srgb8_alpha8",		GL_SRGB8_ALPHA8,	},
		{ "rgb10_a2",			GL_RGB10_A2,		},
		{ "rgb10_a2ui",			GL_RGB10_A2UI,		},
		{ "rgba4",				GL_RGBA4,			},
		{ "rgb5_a1",			GL_RGB5_A1,			},
		{ "rgba8_snorm",		GL_RGBA8_SNORM,		},
		{ "rgb8",				GL_RGB8,			},
		{ "rgb565",				GL_RGB565,			},
		{ "r11f_g11f_b10f",		GL_R11F_G11F_B10F,	},
		{ "rgb32f",				GL_RGB32F,			},
		{ "rgb32i",				GL_RGB32I,			},
		{ "rgb32ui",			GL_RGB32UI,			},
		{ "rgb16f",				GL_RGB16F,			},
		{ "rgb16i",				GL_RGB16I,			},
		{ "rgb16ui",			GL_RGB16UI,			},
		{ "rgb8_snorm",			GL_RGB8_SNORM,		},
		{ "rgb8i",				GL_RGB8I,			},
		{ "rgb8ui",				GL_RGB8UI,			},
		{ "srgb8",				GL_SRGB8,			},
		{ "rgb9_e5",			GL_RGB9_E5,			},
		{ "rg32f",				GL_RG32F,			},
		{ "rg32i",				GL_RG32I,			},
		{ "rg32ui",				GL_RG32UI,			},
		{ "rg16f",				GL_RG16F,			},
		{ "rg16i",				GL_RG16I,			},
		{ "rg16ui",				GL_RG16UI,			},
		{ "rg8",				GL_RG8,				},
		{ "rg8i",				GL_RG8I,			},
		{ "rg8ui",				GL_RG8UI,			},
		{ "rg8_snorm",			GL_RG8_SNORM,		},
		{ "r32f",				GL_R32F,			},
		{ "r32i",				GL_R32I,			},
		{ "r32ui",				GL_R32UI,			},
		{ "r16f",				GL_R16F,			},
		{ "r16i",				GL_R16I,			},
		{ "r16ui",				GL_R16UI,			},
		{ "r8",					GL_R8,				},
		{ "r8i",				GL_R8I,				},
		{ "r8ui",				GL_R8UI,			},
		{ "r8_snorm",			GL_R8_SNORM,		}
	};

	struct
	{
		const char*	name;
		deUint32		internalFormat;
	} sizedDepthStencilFormats[] =
	{
		// Depth and stencil formats
		{ "depth_component32f",	GL_DEPTH_COMPONENT32F	},
		{ "depth_component24",	GL_DEPTH_COMPONENT24	},
		{ "depth_component16",	GL_DEPTH_COMPONENT16	},
		{ "depth32f_stencil8",	GL_DEPTH32F_STENCIL8	},
		{ "depth24_stencil8",	GL_DEPTH24_STENCIL8		}
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(sizedColorFormats); formatNdx++)
	{
		deUint32	internalFormat	= sizedColorFormats[formatNdx].internalFormat;
		string	nameBase		= sizedColorFormats[formatNdx].name;
		string	descriptionBase	= glu::getTextureFormatName(internalFormat);

		sized2DGroup->addChild		(new Texture2DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D").c_str(),			internalFormat, 128, 128));
		sized2DGroup->addChild		(new Texture2DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D").c_str(),			internalFormat,  63, 112));
		sizedCubeGroup->addChild	(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	internalFormat,  64,  64));
		sizedCubeGroup->addChild	(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	internalFormat,  57,  57));
		sized2DArrayGroup->addChild	(new Texture2DArrayFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	internalFormat,  64,  64,  8));
		sized2DArrayGroup->addChild	(new Texture2DArrayFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	internalFormat,  63,  57,  7));
		sized3DGroup->addChild		(new Texture3DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_3D").c_str(),			internalFormat,   8,  32, 16));
		sized3DGroup->addChild		(new Texture3DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_3D").c_str(),			internalFormat,  11,  31,  7));
	}

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(sizedDepthStencilFormats); formatNdx++)
	{
		deUint32	internalFormat	= sizedDepthStencilFormats[formatNdx].internalFormat;
		string	nameBase		= sizedDepthStencilFormats[formatNdx].name;
		string	descriptionBase	= glu::getTextureFormatName(internalFormat);

		sized2DGroup->addChild		(new Texture2DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D").c_str(),			internalFormat, 128, 128));
		sized2DGroup->addChild		(new Texture2DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D").c_str(),			internalFormat,  63, 112));
		sizedCubeGroup->addChild	(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	internalFormat,  64,  64));
		sizedCubeGroup->addChild	(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	internalFormat,  57,  57));
		sized2DArrayGroup->addChild	(new Texture2DArrayFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	internalFormat,  64,  64,  8));
		sized2DArrayGroup->addChild	(new Texture2DArrayFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	internalFormat,  63,  57,  7));
	}

	// ETC-1 compressed formats.
	{
		static const char* filenames[] =
		{
			"data/etc1/photo_helsinki_mip_0.pkm",
			"data/etc1/photo_helsinki_mip_1.pkm",
			"data/etc1/photo_helsinki_mip_2.pkm",
			"data/etc1/photo_helsinki_mip_3.pkm",
			"data/etc1/photo_helsinki_mip_4.pkm",
			"data/etc1/photo_helsinki_mip_5.pkm",
			"data/etc1/photo_helsinki_mip_6.pkm",
			"data/etc1/photo_helsinki_mip_7.pkm"
		};
		compressedGroup->addChild(new Texture2DFileCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_2d_pot", "GL_ETC1_RGB8_OES, GL_TEXTURE_2D", toStringVector(filenames, DE_LENGTH_OF_ARRAY(filenames))));
	}

	{
		vector<string> filenames;
		filenames.push_back("data/etc1/photo_helsinki_113x89.pkm");
		compressedGroup->addChild(new Texture2DFileCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_2d_npot", "GL_ETC1_RGB8_OES, GL_TEXTURE_2D", filenames));
	}

	{
		static const char* faceExt[] = { "neg_x", "pos_x", "neg_y", "pos_y", "neg_z", "pos_z" };

		const int		potNumLevels	= 7;
		vector<string>	potFilenames;
		for (int level = 0; level < potNumLevels; level++)
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				potFilenames.push_back(string("data/etc1/skybox_") + faceExt[face] + "_mip_" + de::toString(level) + ".pkm");

		compressedGroup->addChild(new TextureCubeFileCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_cube_pot", "GL_ETC1_RGB8_OES, GL_TEXTURE_CUBE_MAP", potFilenames));

		vector<string> npotFilenames;
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			npotFilenames.push_back(string("data/etc1/skybox_61x61_") + faceExt[face] + ".pkm");

		compressedGroup->addChild(new TextureCubeFileCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_cube_npot", "GL_ETC_RGB8_OES, GL_TEXTURE_CUBE_MAP", npotFilenames));
	}

	// ETC-2 and EAC compressed formats.
	struct {
		const char*					descriptionBase;
		const char*					nameBase;
		tcu::CompressedTexFormat	format;
	} etc2Formats[] =
	{
		{ "GL_COMPRESSED_R11_EAC",							"eac_r11",							tcu::COMPRESSEDTEXFORMAT_EAC_R11,							},
		{ "GL_COMPRESSED_SIGNED_R11_EAC",					"eac_signed_r11",					tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_R11,					},
		{ "GL_COMPRESSED_RG11_EAC",							"eac_rg11",							tcu::COMPRESSEDTEXFORMAT_EAC_RG11,							},
		{ "GL_COMPRESSED_SIGNED_RG11_EAC",					"eac_signed_rg11",					tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11,					},
		{ "GL_COMPRESSED_RGB8_ETC2",						"etc2_rgb8",						tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8,							},
		{ "GL_COMPRESSED_SRGB8_ETC2",						"etc2_srgb8",						tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8,						},
		{ "GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2",	"etc2_rgb8_punchthrough_alpha1",	tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1,		},
		{ "GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2",	"etc2_srgb8_punchthrough_alpha1",	tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1,	},
		{ "GL_COMPRESSED_RGBA8_ETC2_EAC",					"etc2_eac_rgba8",					tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8,					},
		{ "GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC",			"etc2_eac_srgb8_alpha8",			tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8,				}
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(etc2Formats); formatNdx++)
	{
		string descriptionBase	= etc2Formats[formatNdx].descriptionBase;
		string nameBase			= etc2Formats[formatNdx].nameBase;

		compressedGroup->addChild(new Compressed2DFormatCase	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_2d_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_2D").c_str(),			etc2Formats[formatNdx].format,	1,	128,	64));
		compressedGroup->addChild(new CompressedCubeFormatCase	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_cube_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	etc2Formats[formatNdx].format,	1,	64,		64));
		compressedGroup->addChild(new Compressed2DFormatCase	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_2d_npot").c_str(),		(descriptionBase + ", GL_TEXTURE_2D").c_str(),			etc2Formats[formatNdx].format,	1,	51,		65));
		compressedGroup->addChild(new CompressedCubeFormatCase	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_cube_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	etc2Formats[formatNdx].format,	1,	51,		51));
	}


}